

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  Curl_addrinfo *pCVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  int iVar8;
  _Bool _Var9;
  uint uVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  CURLcode CVar13;
  timediff_t tVar14;
  int *piVar15;
  char *pcVar16;
  Curl_easy *pCVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  curltime cVar22;
  curltime older;
  curltime newer;
  curltime newer_00;
  int error;
  char ipaddress [46];
  int local_a8;
  CURLcode local_a4;
  int local_a0;
  CURLcode local_9c;
  long local_98;
  curltime local_90;
  _Bool *local_80;
  Curl_easy *local_78;
  ulong local_70;
  char local_68 [56];
  
  pCVar17 = conn->data;
  local_a8 = 0;
  *connected = false;
  local_98 = (long)sockindex;
  if ((conn->bits).tcpconnect[local_98] == true) {
    *connected = true;
    CVar11 = CURLE_OK;
  }
  else {
    cVar22 = Curl_now();
    local_90.tv_sec = cVar22.tv_sec;
    local_90.tv_usec = cVar22.tv_usec;
    local_70 = Curl_timeleft(pCVar17,&local_90,true);
    if ((long)local_70 < 0) {
      Curl_failf(pCVar17,"Connection time-out");
      CVar11 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      lVar19 = -1;
      local_a4 = CURLE_OK;
      local_a0 = sockindex;
      local_80 = connected;
      local_78 = pCVar17;
      do {
        if (conn->tempsock[lVar19 + 1] == -1) {
          iVar21 = 6;
          CVar11 = local_a4;
          CVar13 = local_9c;
        }
        else {
          uVar18 = (int)lVar19 + 1U ^ 1;
          uVar10 = Curl_socket_check(-1,-1,conn->tempsock[lVar19 + 1],0);
          if (uVar10 == 2) {
LAB_00416399:
            _Var9 = verifyconnect(conn->tempsock[lVar19 + 1],&local_a8);
            if (_Var9) {
              conn->sock[local_98] = conn->tempsock[lVar19 + 1];
              pCVar1 = conn->tempaddr[lVar19 + 1];
              conn->ip_addr = pCVar1;
              conn->tempsock[lVar19 + 1] = -1;
              (conn->bits).ipv6 = pCVar1->ai_family == 10;
              if (conn->tempsock[uVar18] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar18]);
                conn->tempsock[uVar18] = -1;
              }
              iVar8 = local_a0;
              CVar11 = Curl_connected_proxy(conn,local_a0);
              iVar21 = 1;
              CVar13 = CVar11;
              if (CVar11 == CURLE_OK) {
                (conn->bits).tcpconnect[local_98] = true;
                *local_80 = true;
                if (iVar8 == 0) {
                  Curl_pgrsTime(pCVar17,TIMER_CONNECT);
                }
                Curl_updateconninfo(conn,conn->sock[local_98]);
                Curl_verboseconnect(conn);
                local_a4 = CURLE_OK;
                local_9c = CURLE_OK;
                CVar11 = local_a4;
                CVar13 = local_9c;
              }
              goto LAB_0041656f;
            }
            Curl_infof(pCVar17,"Connection failed\n");
          }
          else if (uVar10 == 0) {
            local_a8 = 0;
            newer.tv_usec = local_90.tv_usec;
            newer.tv_sec = local_90.tv_sec;
            uVar4 = (conn->connecttime).tv_sec;
            uVar5 = (conn->connecttime).tv_usec;
            cVar22.tv_usec = uVar5;
            cVar22.tv_sec = uVar4;
            cVar22._12_4_ = 0;
            newer._12_4_ = 0;
            tVar14 = Curl_timediff(newer,cVar22);
            if (conn->timeoutms_per_addr <= tVar14) {
              Curl_infof(pCVar17,"After %ldms connect time, move on!\n");
              local_a8 = 0x6e;
            }
            if (((lVar19 == -1) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (newer_00.tv_usec = local_90.tv_usec, newer_00.tv_sec = local_90.tv_sec,
               uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
               older.tv_usec = uVar7, older.tv_sec = uVar6, older._12_4_ = 0, newer_00._12_4_ = 0,
               tVar14 = Curl_timediff(newer_00,older),
               (pCVar17->set).happy_eyeballs_timeout <= tVar14)) {
              trynextip(conn,local_a0,1);
            }
          }
          else {
            if ((conn->bits).tcp_fastopen == true) goto LAB_00416399;
            if ((uVar10 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar19 + 1],&local_a8);
            }
          }
          iVar8 = local_a8;
          iVar20 = 0;
          iVar21 = 0;
          CVar11 = local_a4;
          CVar13 = local_9c;
          if (local_a8 != 0) {
            (pCVar17->state).os_errno = local_a8;
            piVar15 = __errno_location();
            *piVar15 = iVar8;
            iVar21 = iVar20;
            CVar11 = local_a4;
            CVar13 = local_9c;
            if (conn->tempaddr[lVar19 + 1] != (Curl_addrinfo *)0x0) {
              Curl_printable_address(conn->tempaddr[lVar19 + 1],local_68,0x2e);
              lVar2 = conn->port;
              pcVar16 = Curl_strerror(conn,local_a8);
              Curl_infof(pCVar17,"connect to %s port %ld failed: %s\n",local_68,lVar2,pcVar16);
              conn->timeoutms_per_addr =
                   local_70 >> (conn->tempaddr[lVar19 + 1]->ai_next != (Curl_addrinfo *)0x0);
              CVar12 = trynextip(conn,local_a0,(int)lVar19 + 1);
              pCVar17 = local_78;
              CVar13 = local_9c;
              if ((CVar12 != CURLE_COULDNT_CONNECT) ||
                 (CVar11 = local_a4, conn->tempsock[uVar18] == -1)) {
                CVar11 = CVar12;
              }
            }
          }
        }
LAB_0041656f:
        local_9c = CVar13;
        local_a4 = CVar11;
        if ((iVar21 != 6) && (iVar21 != 0)) {
          return local_9c;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 == 0);
      CVar11 = CURLE_OK;
      if ((local_a4 != CURLE_OK) &&
         ((CVar13 = local_a4, conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (CVar13 = trynextip(conn,local_a0,1), CVar11 = CURLE_OK, CVar13 != CURLE_OK)))) {
        CVar11 = CVar13;
        lVar19 = 0x118;
        if (((conn->bits).socksproxy == false) &&
           ((lVar19 = 0x158, (conn->bits).httpproxy == false &&
            (lVar19 = 0xd0, (conn->bits).conn_to_host != false)))) {
          lVar19 = 0xf8;
        }
        uVar3 = *(undefined8 *)((conn->chunk).hexbuffer + lVar19 + -0x20);
        lVar19 = conn->port;
        pcVar16 = Curl_strerror(conn,local_a8);
        Curl_failf(pCVar17,"Failed to connect to %s port %ld: %s",uVar3,lVar19,pcVar16);
      }
    }
  }
  return CVar11;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(Curl_timediff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */

    const char *hostname;

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
        hostname, conn->port, Curl_strerror(conn, error));
  }

  return result;
}